

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall
tchecker::clockbounds::df_solver_t::updateU
          (df_solver_t *this,clock_id_t i,clock_id_t j,ineq_cmp_t cmp,integer_t value)

{
  db_t dVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  invalid_argument *this_00;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  uVar2 = this->_dim;
  if (uVar2 <= i) {
    __assert_fail("i < _dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                  ,0xf0,
                  "void tchecker::clockbounds::df_solver_t::updateU(tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
                 );
  }
  uVar5 = (ulong)j;
  if (uVar5 < uVar2) {
    if (0x80000000 < value + 0xc0000001U) {
      lVar4 = uVar2 * i;
      iVar6 = value * 2 >> 1;
      dVar1 = this->_U[lVar4 + uVar5];
      iVar7 = (int)dVar1 >> 1;
      bVar3 = iVar6 < iVar7;
      if (iVar6 == iVar7) {
        bVar3 = (cmp & LE) < ((uint)dVar1 & LE);
      }
      if (bVar3) {
        this->_U[lVar4 + uVar5] = (db_t)(value * 2 | cmp & LE);
        this->_updated_U = true;
      }
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"value out of bounds");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __assert_fail("j < _dim",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/clockbounds/solver.cc"
                ,0xf1,
                "void tchecker::clockbounds::df_solver_t::updateU(tchecker::clock_id_t, tchecker::clock_id_t, tchecker::ineq_cmp_t, tchecker::integer_t)"
               );
}

Assistant:

void df_solver_t::updateU(tchecker::clock_id_t i, tchecker::clock_id_t j, tchecker::ineq_cmp_t cmp, tchecker::integer_t value)
{
  assert(i < _dim);
  assert(j < _dim);
  tchecker::dbm::db_t bound = tchecker::dbm::db(cmp, value);
  if (bound < _U[i * _dim + j]) {
    _U[i * _dim + j] = bound;
    _updated_U = true;
  }
}